

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metee_linux.c
# Opt level: O0

int TeeGetDeviceHandle(PTEEHANDLE handle)

{
  long *in_RDI;
  mei *me;
  int local_c;
  
  if (in_RDI == (long *)0x0) {
    local_c = 4;
  }
  else if (*in_RDI == 0) {
    if ((in_RDI != (long *)0x0) && (1 < *(uint *)((long)in_RDI + 0x14))) {
      if (in_RDI[3] == 0) {
        syslog(7,"TEELIB: (%s:%s():%d) Internal structure is not initialized\n",
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
               ,"TeeGetDeviceHandle",0x1e5);
      }
      else {
        (*(code *)in_RDI[3])
                  (0,"TEELIB: (%s:%s():%d) Internal structure is not initialized\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                   ,"TeeGetDeviceHandle",0x1e5);
      }
    }
    local_c = -1;
  }
  else {
    local_c = *(int *)(*in_RDI + 0x18);
  }
  return local_c;
}

Assistant:

TEE_DEVICE_HANDLE TEEAPI TeeGetDeviceHandle(IN PTEEHANDLE handle)
{
	struct mei *me = to_mei(handle);

	if (!handle) {
		return TEE_INVALID_PARAMETER;
	}

	if (!me) {
		DBGPRINT(handle, "Internal structure is not initialized\n");
		return TEE_INVALID_DEVICE_HANDLE;
	}
	
	return me->fd;
}